

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BottomLevelASBase.cpp
# Opt level: O0

void Diligent::CopyBLASGeometryDesc
               (BottomLevelASDesc *SrcDesc,BottomLevelASDesc *DstDesc,FixedLinearAllocator *MemPool,
               BLASNameToIndex *pSrcNameToIndex,BLASNameToIndex *DstNameToIndex)

{
  unordered_map<Diligent::HashMapStringKey,Diligent::BLASGeomIndex,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>>
  *puVar1;
  BLASNameToIndex *pBVar2;
  bool bVar3;
  char (*pacVar4) [31];
  Char *pCVar5;
  pointer pvVar6;
  pair<std::__detail::_Node_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>,_bool>
  pVar7;
  BLASGeomIndex local_160;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_158;
  byte local_150;
  byte local_141;
  undefined1 local_140 [7];
  bool IsUniqueName_1;
  string msg_1;
  HashMapStringKey local_118;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_108;
  const_iterator iter_1;
  char (*pacStack_f8) [31];
  Uint32 ActualIndex_1;
  char *GeoName_1;
  BLASBoundingBoxDesc *pBStack_e8;
  Uint32 i_3;
  BLASBoundingBoxDesc *pBoxes;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  _Stack_d8;
  Uint32 i_2;
  byte local_d0;
  BLASGeomIndex local_c8;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_c0;
  byte local_b8;
  byte local_a9;
  undefined1 local_a8 [7];
  bool IsUniqueName;
  string msg;
  HashMapStringKey local_70;
  _Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
  local_60;
  const_iterator iter;
  char (*pacStack_50) [31];
  Uint32 ActualIndex;
  char *GeoName;
  BLASTriangleDesc *pBStack_40;
  Uint32 i_1;
  BLASTriangleDesc *pTriangles;
  unordered_map<Diligent::HashMapStringKey,Diligent::BLASGeomIndex,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>>
  *puStack_30;
  Uint32 i;
  BLASNameToIndex *DstNameToIndex_local;
  BLASNameToIndex *pSrcNameToIndex_local;
  FixedLinearAllocator *MemPool_local;
  BottomLevelASDesc *DstDesc_local;
  BottomLevelASDesc *SrcDesc_local;
  
  puStack_30 = (unordered_map<Diligent::HashMapStringKey,Diligent::BLASGeomIndex,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>>
                *)DstNameToIndex;
  DstNameToIndex_local = pSrcNameToIndex;
  pSrcNameToIndex_local = (BLASNameToIndex *)MemPool;
  MemPool_local = (FixedLinearAllocator *)DstDesc;
  DstDesc_local = SrcDesc;
  if (SrcDesc->pTriangles == (BLASTriangleDesc *)0x0) {
    if (SrcDesc->pBoxes == (BLASBoundingBoxDesc *)0x0) {
      LogError<true,char[45]>
                (false,"CopyBLASGeometryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                 ,0xba,(char (*) [45])"Either pTriangles or pBoxes must not be null");
    }
    else {
      FixedLinearAllocator::AddSpace<Diligent::BLASBoundingBoxDesc_const&>
                (MemPool,(ulong)SrcDesc->BoxCount);
      for (pBoxes._4_4_ = 0; pBoxes._4_4_ < DstDesc_local->BoxCount; pBoxes._4_4_ = pBoxes._4_4_ + 1
          ) {
        FixedLinearAllocator::AddSpaceForString
                  ((FixedLinearAllocator *)pSrcNameToIndex_local,
                   DstDesc_local->pBoxes[pBoxes._4_4_].GeometryName,0);
      }
      FixedLinearAllocator::Reserve((FixedLinearAllocator *)pSrcNameToIndex_local);
      pBStack_e8 = FixedLinearAllocator::CopyArray<Diligent::BLASBoundingBoxDesc>
                             ((FixedLinearAllocator *)pSrcNameToIndex_local,DstDesc_local->pBoxes,
                              (ulong)DstDesc_local->BoxCount);
      for (GeoName_1._4_4_ = 0; GeoName_1._4_4_ < DstDesc_local->BoxCount;
          GeoName_1._4_4_ = GeoName_1._4_4_ + 1) {
        pacVar4 = (char (*) [31])
                  FixedLinearAllocator::CopyString
                            ((FixedLinearAllocator *)pSrcNameToIndex_local,
                             DstDesc_local->pBoxes[GeoName_1._4_4_].GeometryName,0);
        pBVar2 = DstNameToIndex_local;
        pBStack_e8[GeoName_1._4_4_].GeometryName = (Char *)pacVar4;
        iter_1.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
        ._M_cur._4_4_ = 0xffffffff;
        pacStack_f8 = pacVar4;
        if (DstNameToIndex_local != (BLASNameToIndex *)0x0) {
          HashMapStringKey::HashMapStringKey(&local_118,(Char *)pacVar4,false);
          local_108._M_cur =
               (__node_type *)
               std::
               unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
               ::find(pBVar2,&local_118);
          HashMapStringKey::~HashMapStringKey(&local_118);
          msg_1.field_2._8_8_ =
               std::
               unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
               ::end(DstNameToIndex_local);
          bVar3 = std::__detail::operator!=
                            (&local_108,
                             (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                              *)((long)&msg_1.field_2 + 8));
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            FormatString<char[26],char[31]>
                      ((string *)local_140,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar4);
            pCVar5 = (Char *)std::__cxx11::string::c_str();
            DebugAssertionFailed
                      (pCVar5,"CopyBLASGeometryDesc",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                       ,0xaa);
            std::__cxx11::string::~string((string *)local_140);
          }
          pvVar6 = std::__detail::
                   _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                   ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                                 *)&local_108);
          iter_1.
          super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
          ._M_cur._4_4_ = (pvVar6->second).ActualIndex;
        }
        puVar1 = puStack_30;
        BLASGeomIndex::BLASGeomIndex
                  (&local_160,GeoName_1._4_4_,
                   iter_1.
                   super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                   ._M_cur._4_4_);
        pVar7 = std::
                unordered_map<Diligent::HashMapStringKey,Diligent::BLASGeomIndex,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>>
                ::emplace<char_const*&,Diligent::BLASGeomIndex>
                          (puVar1,(char **)&stack0xffffffffffffff08,&local_160);
        local_158._M_cur =
             (__node_type *)
             pVar7.first.
             super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
             ._M_cur;
        local_150 = pVar7.second;
        local_141 = local_150 & 1;
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          LogError<true,char[16],char_const*,char[16]>
                    (false,"CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0xb0,(char (*) [16])"Geometry name \'",(char **)&stack0xffffffffffffff08,
                     (char (*) [16])"\' is not unique");
        }
      }
      MemPool_local->m_CurrAlignment = (size_t)pBStack_e8;
      *(Uint32 *)&MemPool_local->m_pAllocator = DstDesc_local->BoxCount;
      MemPool_local->m_pCurrPtr = (uint8_t *)0x0;
      *(undefined4 *)&MemPool_local->m_ReservedSize = 0;
    }
  }
  else {
    FixedLinearAllocator::AddSpace<Diligent::BLASTriangleDesc_const&>
              (MemPool,(ulong)SrcDesc->TriangleCount);
    for (pTriangles._4_4_ = 0; pTriangles._4_4_ < DstDesc_local->TriangleCount;
        pTriangles._4_4_ = pTriangles._4_4_ + 1) {
      FixedLinearAllocator::AddSpaceForString
                ((FixedLinearAllocator *)pSrcNameToIndex_local,
                 DstDesc_local->pTriangles[pTriangles._4_4_].GeometryName,0);
    }
    FixedLinearAllocator::Reserve((FixedLinearAllocator *)pSrcNameToIndex_local);
    pBStack_40 = FixedLinearAllocator::CopyArray<Diligent::BLASTriangleDesc>
                           ((FixedLinearAllocator *)pSrcNameToIndex_local,DstDesc_local->pTriangles,
                            (ulong)DstDesc_local->TriangleCount);
    for (GeoName._4_4_ = 0; GeoName._4_4_ < DstDesc_local->TriangleCount;
        GeoName._4_4_ = GeoName._4_4_ + 1) {
      pacVar4 = (char (*) [31])
                FixedLinearAllocator::CopyString
                          ((FixedLinearAllocator *)pSrcNameToIndex_local,
                           DstDesc_local->pTriangles[GeoName._4_4_].GeometryName,0);
      pBVar2 = DstNameToIndex_local;
      pBStack_40[GeoName._4_4_].GeometryName = (Char *)pacVar4;
      iter.
      super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
      ._M_cur._4_4_ = 0xffffffff;
      pacStack_50 = pacVar4;
      if (DstNameToIndex_local != (BLASNameToIndex *)0x0) {
        HashMapStringKey::HashMapStringKey(&local_70,(Char *)pacVar4,false);
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
             ::find(pBVar2,&local_70);
        HashMapStringKey::~HashMapStringKey(&local_70);
        msg.field_2._8_8_ =
             std::
             unordered_map<Diligent::HashMapStringKey,_Diligent::BLASGeomIndex,_std::hash<Diligent::HashMapStringKey>,_std::equal_to<Diligent::HashMapStringKey>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>_>_>
             ::end(DstNameToIndex_local);
        bVar3 = std::__detail::operator!=
                          (&local_60,
                           (_Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                            *)((long)&msg.field_2 + 8));
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          FormatString<char[26],char[31]>
                    ((string *)local_a8,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"iter != pSrcNameToIndex->end()",pacVar4);
          pCVar5 = (Char *)std::__cxx11::string::c_str();
          DebugAssertionFailed
                    (pCVar5,"CopyBLASGeometryDesc",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                     ,0x87);
          std::__cxx11::string::~string((string *)local_a8);
        }
        pvVar6 = std::__detail::
                 _Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                 ::operator->((_Node_const_iterator<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false,_false>
                               *)&local_60);
        iter.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
        ._M_cur._4_4_ = (pvVar6->second).ActualIndex;
      }
      puVar1 = puStack_30;
      BLASGeomIndex::BLASGeomIndex
                (&local_c8,GeoName._4_4_,
                 iter.
                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
                 ._M_cur._4_4_);
      pVar7 = std::
              unordered_map<Diligent::HashMapStringKey,Diligent::BLASGeomIndex,std::hash<Diligent::HashMapStringKey>,std::equal_to<Diligent::HashMapStringKey>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::BLASGeomIndex>>>
              ::emplace<char_const*&,Diligent::BLASGeomIndex>
                        (puVar1,(char **)&stack0xffffffffffffffb0,&local_c8);
      _Stack_d8._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_Diligent::BLASGeomIndex>,_false>
           ._M_cur;
      local_d0 = pVar7.second;
      local_a9 = local_d0 & 1;
      local_c0._M_cur = _Stack_d8._M_cur;
      local_b8 = local_d0;
      if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        LogError<true,char[16],char_const*,char[16]>
                  (false,"CopyBLASGeometryDesc",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/BottomLevelASBase.cpp"
                   ,0x8d,(char (*) [16])"Geometry name \'",(char **)&stack0xffffffffffffffb0,
                   (char (*) [16])"\' is not unique");
      }
    }
    MemPool_local->m_pCurrPtr = (uint8_t *)pBStack_40;
    *(Uint32 *)&MemPool_local->m_ReservedSize = DstDesc_local->TriangleCount;
    MemPool_local->m_CurrAlignment = 0;
    *(undefined4 *)&MemPool_local->m_pAllocator = 0;
  }
  return;
}

Assistant:

void CopyBLASGeometryDesc(const BottomLevelASDesc& SrcDesc,
                          BottomLevelASDesc&       DstDesc,
                          FixedLinearAllocator&    MemPool,
                          const BLASNameToIndex*   pSrcNameToIndex,
                          BLASNameToIndex&         DstNameToIndex) noexcept(false)
{
    if (SrcDesc.pTriangles != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pTriangles)>(SrcDesc.TriangleCount);

        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pTriangles[i].GeometryName);

        MemPool.Reserve();

        BLASTriangleDesc* pTriangles = MemPool.CopyArray(SrcDesc.pTriangles, SrcDesc.TriangleCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
        {
            const char* GeoName        = MemPool.CopyString(SrcDesc.pTriangles[i].GeometryName);
            pTriangles[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pTriangles    = pTriangles;
        DstDesc.TriangleCount = SrcDesc.TriangleCount;
        DstDesc.pBoxes        = nullptr;
        DstDesc.BoxCount      = 0;
    }
    else if (SrcDesc.pBoxes != nullptr)
    {
        MemPool.AddSpace<decltype(*SrcDesc.pBoxes)>(SrcDesc.BoxCount);

        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            MemPool.AddSpaceForString(SrcDesc.pBoxes[i].GeometryName);

        MemPool.Reserve();

        BLASBoundingBoxDesc* pBoxes = MemPool.CopyArray(SrcDesc.pBoxes, SrcDesc.BoxCount);

        // Copy strings
        for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
        {
            const char* GeoName    = MemPool.CopyString(SrcDesc.pBoxes[i].GeometryName);
            pBoxes[i].GeometryName = GeoName;

            Uint32 ActualIndex = INVALID_INDEX;
            if (pSrcNameToIndex)
            {
                auto iter = pSrcNameToIndex->find(GeoName);
                VERIFY_EXPR(iter != pSrcNameToIndex->end());
                ActualIndex = iter->second.ActualIndex;
            }

            bool IsUniqueName = DstNameToIndex.emplace(GeoName, BLASGeomIndex{i, ActualIndex}).second;
            if (!IsUniqueName)
                LOG_ERROR_AND_THROW("Geometry name '", GeoName, "' is not unique");
        }

        DstDesc.pBoxes        = pBoxes;
        DstDesc.BoxCount      = SrcDesc.BoxCount;
        DstDesc.pTriangles    = nullptr;
        DstDesc.TriangleCount = 0;
    }
    else
    {
        LOG_ERROR_AND_THROW("Either pTriangles or pBoxes must not be null");
    }
}